

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O2

void __thiscall MainLoop::p_Update(MainLoop *this)

{
  pointer pfVar1;
  pointer pfVar2;
  int iVar3;
  duration dVar4;
  function<void_()> *odU;
  function<void_()> *this_00;
  function<void_(float)> *this_01;
  function<void_()> *oU;
  pointer this_02;
  pointer this_03;
  float __args;
  
  pfVar2 = onUpdate.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = onUpdate.
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pfVar2; this_02 = this_02 + 1
      ) {
    std::function<void_()>::operator()(this_02);
  }
  if ((p_Update()::lastTime == '\0') &&
     (iVar3 = __cxa_guard_acquire(&p_Update()::lastTime), iVar3 != 0)) {
    p_Update::lastTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    __cxa_guard_release(&p_Update()::lastTime);
  }
  dVar4.__r = std::chrono::_V2::system_clock::now();
  pfVar1 = onDeltaUpdate.
           super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __args = (float)(dVar4.__r - (long)p_Update::lastTime.__d.__r) / 1e+09;
  p_Update::lastTime.__d.__r = (duration)(duration)dVar4.__r;
  for (this_03 = onDeltaUpdate.
                 super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pfVar2 = onDelayedUpdate.
               super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Vector_impl_data._M_finish, this_03 != pfVar1; this_03 = this_03 + 1)
  {
    std::function<void_(float)>::operator()(this_03,__args);
  }
  p_Update::delayedUpdateTimeoutSoFar = __args + p_Update::delayedUpdateTimeoutSoFar;
  this_00 = onDelayedUpdate.
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->p_delay_length <= p_Update::delayedUpdateTimeoutSoFar &&
      p_Update::delayedUpdateTimeoutSoFar != this->p_delay_length) {
    for (; pfVar1 = onDelayedDeltaUpdate.
                    super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        this_01 = onDelayedDeltaUpdate.
                  super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, this_00 != pfVar2;
        this_00 = this_00 + 1) {
      std::function<void_()>::operator()(this_00);
    }
    for (; this_01 != pfVar1; this_01 = this_01 + 1) {
      std::function<void_(float)>::operator()(this_01,p_Update::delayedUpdateTimeoutSoFar);
    }
    p_Update::delayedUpdateTimeoutSoFar = 0.0;
  }
  return;
}

Assistant:

void MainLoop::p_Update()
{

	for (const auto &oU : onUpdate)
	{
		oU();
	}

	static std::chrono::system_clock::time_point currTime;
	static std::chrono::system_clock::time_point lastTime = std::chrono::system_clock::now();
	static std::chrono::duration<float> deltaTime;

	currTime = std::chrono::system_clock::now();
	deltaTime = currTime - lastTime;
	lastTime = currTime;

	float elapsedTime = deltaTime.count();
	for (const auto &oDU : onDeltaUpdate)
	{
		oDU(elapsedTime);
	}

	static float delayedUpdateTimeoutSoFar = 0.f;
	delayedUpdateTimeoutSoFar += elapsedTime;
	if (delayedUpdateTimeoutSoFar > p_delay_length)
	{
		for (auto &odU : onDelayedUpdate)
		{
			odU();
		}
		for (auto &odDU : onDelayedDeltaUpdate)
		{
			odDU(delayedUpdateTimeoutSoFar); //combines all missed delta time since last update
		}
		delayedUpdateTimeoutSoFar = 0.f; // reset
	}
}